

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O1

void __thiscall Subscriber::on_error(Subscriber *this,Poll *p,int event)

{
  ostream *poVar1;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": on_error event_code=",0x16);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,event);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," errno=",7);
  from_errno_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_48,local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  Poll::unsubscribe(p,this);
  return;
}

Assistant:

void Subscriber::on_error(Poll &p, int event) {
  std::cout << this->name << ": on_error event_code=" << event << " errno=" << from_errno() << std::endl;
  p.unsubscribe(*this);
}